

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uregex.cpp
# Opt level: O2

int32_t icu_63::RegexCImpl::appendReplacement
                  (RegularExpression *regexp,UChar *replacementText,int32_t replacementLength,
                  UChar **destBuf,int32_t *destCapacity,UErrorCode *status)

{
  UChar UVar1;
  bool bVar2;
  RegexMatcher *pRVar3;
  UErrorCode UVar4;
  UBool UVar5;
  int iVar6;
  int32_t iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  UErrorCode UVar11;
  long lVar12;
  uint uVar13;
  UChar *dest;
  int iVar14;
  undefined8 unaff_RBX;
  ulong uVar15;
  RegularExpression *regexp2;
  uint uVar16;
  ulong uVar17;
  uint local_c8;
  uint local_c4;
  UChar *local_c0;
  ulong local_b8;
  uint local_ac;
  int *local_a8;
  RegularExpression *local_a0;
  long local_98;
  UChar **local_90;
  UErrorCode *local_88;
  RegexMatcher *local_80;
  UObject local_78;
  UErrorCode tempStatus;
  uint uStack_6c;
  StackBufferOrFields local_68;
  
  uVar15 = CONCAT71((int7)((ulong)unaff_RBX >> 8),1);
  if (((destCapacity != (int32_t *)0x0) && (*status == U_BUFFER_OVERFLOW_ERROR)) &&
     (*destCapacity == 0)) {
    *status = U_ZERO_ERROR;
    uVar15 = 0;
  }
  local_90 = destBuf;
  UVar5 = validateRE(regexp,'\x01',status);
  if (UVar5 != '\0') {
    if (((local_90 != (UChar **)0x0) && (replacementText != (UChar *)0x0)) &&
       ((-2 < replacementLength && (destCapacity != (int32_t *)0x0)))) {
      local_c0 = *local_90;
      uVar13 = *destCapacity;
      if (((int)uVar13 < 1 || local_c0 != (UChar *)0x0) && -1 < (int)uVar13) {
        local_80 = regexp->fMatcher;
        if (local_80->fMatch == '\0') {
          *status = U_REGEX_INVALID_STATE;
          return 0;
        }
        local_b8 = (ulong)uVar13;
        local_c8 = replacementLength;
        if (replacementLength == -1) {
          local_c8 = u_strlen_63(replacementText);
        }
        pRVar3 = local_80;
        local_a8 = destCapacity;
        if (regexp->fText == (UChar *)0x0) {
          _tempStatus = (_func_int **)((ulong)uStack_6c << 0x20);
          uVar13 = utext_extract_63(local_80->fInputText,local_80->fLastMatchEnd,
                                    local_80->fMatchStart,local_c0,(int32_t)local_b8,&tempStatus);
          uVar17 = (ulong)uVar13;
        }
        else {
          if (local_80->fInputText->pFuncs->mapNativeIndexToUTF16 ==
              (UTextMapNativeIndexToUTF16 *)0x0) {
            iVar8 = (int)local_80->fMatchStart;
            iVar6 = (int)local_80->fLastMatchEnd;
          }
          else {
            _tempStatus = (_func_int **)((ulong)uStack_6c << 0x20);
            iVar6 = utext_extract_63(local_80->fInputText,0,local_80->fLastMatchEnd,(UChar *)0x0,0,
                                     &tempStatus);
            _tempStatus = _tempStatus & 0xffffffff00000000;
            iVar7 = utext_extract_63(pRVar3->fInputText,pRVar3->fLastMatchEnd,pRVar3->fMatchStart,
                                     (UChar *)0x0,0,&tempStatus);
            iVar8 = iVar7 + iVar6;
          }
          uVar17 = 0;
          for (lVar12 = (long)iVar6; destCapacity = local_a8, lVar12 < iVar8; lVar12 = lVar12 + 1) {
            if (uVar17 < local_b8) {
              local_c0[uVar17] = regexp->fText[lVar12];
            }
            uVar17 = uVar17 + 1;
          }
        }
        if (0 < (int)local_c8) {
          local_c4 = 0;
          local_78._vptr_UObject = (_func_int **)&PTR__UnicodeString_0024c170;
          local_ac = (uint)uVar15;
          local_a0 = regexp;
          local_88 = status;
          while (*status < U_ILLEGAL_ARGUMENT_ERROR) {
            UVar1 = replacementText[(int)local_c4];
            uVar13 = local_c4 + 1;
            iVar8 = (int)uVar17;
            local_98 = (long)iVar8;
            if (UVar1 == L'$') {
              uVar16 = 0xffffffff;
              if ((int)uVar13 < (int)local_c8) {
                UVar1 = replacementText[(int)uVar13];
                uVar16 = (uint)(ushort)UVar1;
                if ((((UVar1 & 0xfc00U) == 0xd800) &&
                    (uVar16 = (uint)(ushort)UVar1, local_c4 + 2 != local_c8)) &&
                   (((ushort)replacementText[(int)(local_c4 + 2)] & 0xfc00) == 0xdc00)) {
                  uVar16 = (uint)(ushort)UVar1 * 0x400 +
                           (uint)(ushort)replacementText[(int)(local_c4 + 2)] + 0xfca02400;
                }
              }
              local_c4 = uVar13;
              UVar5 = u_isdigit_63(uVar16);
              if (UVar5 == '\0') {
                UVar4 = U_REGEX_INVALID_CAPTURE_GROUP_NAME;
                if (uVar16 == 0x7b) {
                  _tempStatus = local_78._vptr_UObject;
                  local_68.fStackFields.fLengthAndFlags = 2;
                  uVar13 = local_c4 + 1;
                  if ((uVar13 != local_c8 && (replacementText[(int)local_c4] & 0xfc00U) == 0xd800)
                     && ((replacementText[(long)(int)local_c4 + 1] & 0xfc00U) == 0xdc00)) {
                    uVar13 = local_c4 + 2;
                  }
                  local_c4 = uVar13;
                  iVar6 = 0;
                  uVar13 = 0x7b;
LAB_0015f5cc:
                  while( true ) {
                    regexp2 = local_a0;
                    if ((uVar13 == 0x7d) || (U_ZERO_ERROR < *status)) goto LAB_0015f717;
                    if ((int)local_c8 <= (int)local_c4) break;
                    uVar16 = local_c4 + 1;
                    UVar1 = replacementText[(int)local_c4];
                    uVar13 = (uint)(ushort)UVar1;
                    if ((((UVar1 & 0xfc00U) == 0xd800) && (uVar16 != local_c8)) &&
                       (((ushort)replacementText[(long)(int)local_c4 + 1] & 0xfc00) == 0xdc00)) {
                      uVar13 = (uint)(ushort)UVar1 * 0x400 +
                               (uint)(ushort)replacementText[(long)(int)local_c4 + 1] + 0xfca02400;
                      uVar16 = local_c4 + 2;
                    }
                    local_c4 = uVar16;
                    if (8 < uVar13 - 0x31 && 0x19 < (uVar13 & 0xffffffdf) - 0x41) {
                      if (uVar13 == 0x7d) goto code_r0x0015f676;
                      goto LAB_0015f69c;
                    }
                    UnicodeString::append((UnicodeString *)&tempStatus,uVar13);
                  }
                  *status = U_REGEX_INVALID_CAPTURE_GROUP_NAME;
LAB_0015f717:
                  UnicodeString::~UnicodeString((UnicodeString *)&tempStatus);
                  goto LAB_0015f71f;
                }
LAB_0015f773:
                UVar11 = UVar4;
                *status = UVar11;
              }
              else {
                iVar10 = local_80->fPattern->fGroupMap->count;
                iVar14 = 0;
                iVar6 = 0;
                while (status = local_88, regexp2 = local_a0, (int)local_c4 < (int)local_c8) {
                  uVar13 = (uint)(ushort)replacementText[(int)local_c4];
                  if ((uVar13 & 0xf800) == 0xd800) {
                    if (((ushort)replacementText[(int)local_c4] >> 10 & 1) == 0) {
                      if ((local_c4 + 1 != local_c8) &&
                         (uVar16 = (uint)(ushort)replacementText[(int)(local_c4 + 1)],
                         (replacementText[(int)(local_c4 + 1)] & 0xfc00U) == 0xdc00)) {
                        uVar13 = uVar13 << 10;
LAB_0015f482:
                        uVar13 = uVar13 + uVar16 + 0xfca02400;
                      }
                    }
                    else if ((0 < (int)local_c4) &&
                            ((replacementText[(ulong)local_c4 - 1] & 0xfc00U) == 0xd800)) {
                      uVar16 = (uint)(ushort)replacementText[(ulong)local_c4 - 1] << 10;
                      goto LAB_0015f482;
                    }
                  }
                  UVar5 = u_isdigit_63(uVar13);
                  status = local_88;
                  regexp2 = local_a0;
                  if (UVar5 == '\0') break;
                  iVar7 = u_charDigitValue_63(uVar13);
                  iVar9 = iVar6 * 10 + iVar7;
                  if (iVar10 < iVar9) {
                    status = local_88;
                    regexp2 = local_a0;
                    if (iVar14 == 0) {
                      UVar4 = U_INDEX_OUTOFBOUNDS_ERROR;
                      goto LAB_0015f773;
                    }
                    break;
                  }
                  uVar13 = local_c4 + 1;
                  if ((uVar13 != local_c8 && (replacementText[(int)local_c4] & 0xfc00U) == 0xd800)
                     && ((replacementText[(long)(int)local_c4 + 1] & 0xfc00U) == 0xdc00)) {
                    uVar13 = local_c4 + 2;
                  }
                  local_c4 = uVar13;
                  iVar14 = iVar14 + -1;
                  iVar6 = iVar9;
                }
LAB_0015f71f:
                UVar11 = *status;
                if (UVar11 < U_ILLEGAL_ARGUMENT_ERROR) {
                  dest = local_c0 + local_98;
                  if (local_c0 == (UChar *)0x0) {
                    dest = (UChar *)0x0;
                  }
                  iVar10 = (int)local_b8 - (int)local_98;
                  if (iVar10 < 1) {
                    iVar10 = 0;
                  }
                  iVar7 = uregex_group_63((URegularExpression *)regexp2,iVar6,dest,iVar10,status);
                  UVar11 = *status;
                  uVar17 = (ulong)(uint)(iVar7 + iVar8);
                  UVar4 = U_ZERO_ERROR;
                  if (UVar11 == U_BUFFER_OVERFLOW_ERROR) goto LAB_0015f773;
                }
              }
              bVar2 = UVar11 < U_ILLEGAL_ARGUMENT_ERROR;
              destCapacity = local_a8;
LAB_0015f77d:
              uVar15 = (ulong)local_ac;
            }
            else {
              if (UVar1 == L'\\') {
                if ((int)local_c8 <= (int)uVar13) break;
                UVar1 = replacementText[(int)uVar13];
                local_c4 = uVar13;
                if (((UVar1 & 0xffdfU) != 0x55) ||
                   (uVar13 = u_unescapeAt_63(uregex_ucstr_unescape_charAt_63,(int32_t *)&local_c4,
                                             local_c8,replacementText), uVar13 == 0xffffffff)) {
                  if (iVar8 < (int)local_b8) {
                    local_c0[local_98] = UVar1;
                  }
                  uVar17 = (ulong)(iVar8 + 1);
                  local_c4 = local_c4 + 1;
                  bVar2 = true;
                  goto LAB_0015f77d;
                }
                if ((int)uVar13 < 0x10000) {
                  uVar15 = (ulong)local_ac;
                  if (iVar8 < (int)local_b8) {
                    local_c0[local_98] = (UChar)uVar13;
                  }
                  goto LAB_0015f51b;
                }
                uVar15 = (ulong)local_ac;
                if (iVar8 < (int)local_b8) {
                  local_c0[local_98] = (short)(uVar13 >> 10) + L'ퟀ';
                }
                if (iVar8 + 1 < (int)local_b8) {
                  local_c0[iVar8 + 1] = (UChar)uVar13 & 0x3ffU | 0xdc00;
                }
                uVar13 = iVar8 + 2;
              }
              else {
                local_c4 = uVar13;
                if (iVar8 < (int)local_b8) {
                  local_c0[local_98] = UVar1;
                }
LAB_0015f51b:
                uVar13 = iVar8 + 1;
              }
              uVar17 = (ulong)uVar13;
              bVar2 = true;
            }
            if ((!bVar2) || ((int)local_c8 <= (int)local_c4)) break;
          }
        }
        iVar8 = (int)uVar17;
        if (iVar8 < (int)local_b8) {
          local_c0[iVar8] = L'\0';
        }
        else if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
          if (iVar8 == *destCapacity) {
            *status = U_STRING_NOT_TERMINATED_WARNING;
          }
          else {
            *status = U_BUFFER_OVERFLOW_ERROR;
          }
        }
        if ((0 < iVar8) && (iVar6 = *destCapacity, 0 < iVar6)) {
          if (iVar8 < (int)local_b8) {
            *local_90 = *local_90 + (uVar17 & 0xffffffff);
            iVar6 = iVar6 - iVar8;
          }
          else {
            *local_90 = *local_90 + local_b8;
            iVar6 = 0;
          }
          *destCapacity = iVar6;
        }
        if ((char)uVar15 != '\0') {
          return iVar8;
        }
        if (U_ZERO_ERROR < *status) {
          return iVar8;
        }
        *status = U_BUFFER_OVERFLOW_ERROR;
        return iVar8;
      }
    }
    *status = U_ILLEGAL_ARGUMENT_ERROR;
  }
  return 0;
code_r0x0015f676:
  iVar6 = uhash_geti_63(local_a0->fPat->fNamedCaptureMap,(UnicodeString *)&tempStatus);
  if (iVar6 == 0) {
    iVar6 = 0;
LAB_0015f69c:
    *status = U_REGEX_INVALID_CAPTURE_GROUP_NAME;
  }
  goto LAB_0015f5cc;
}

Assistant:

int32_t RegexCImpl::appendReplacement(RegularExpression    *regexp,
                                      const UChar           *replacementText,
                                      int32_t                replacementLength,
                                      UChar                **destBuf,
                                      int32_t               *destCapacity,
                                      UErrorCode            *status)  {

    // If we come in with a buffer overflow error, don't suppress the operation.
    //  A series of appendReplacements, appendTail need to correctly preflight
    //  the buffer size when an overflow happens somewhere in the middle.
    UBool pendingBufferOverflow = FALSE;
    if (*status == U_BUFFER_OVERFLOW_ERROR && destCapacity != NULL && *destCapacity == 0) {
        pendingBufferOverflow = TRUE;
        *status = U_ZERO_ERROR;
    }

    //
    // Validate all paramters
    //
    if (validateRE(regexp, TRUE, status) == FALSE) {
        return 0;
    }
    if (replacementText == NULL || replacementLength < -1 ||
        destCapacity == NULL || destBuf == NULL ||
        (*destBuf == NULL && *destCapacity > 0) ||
        *destCapacity < 0) {
        *status = U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    RegexMatcher *m = regexp->fMatcher;
    if (m->fMatch == FALSE) {
        *status = U_REGEX_INVALID_STATE;
        return 0;
    }

    UChar    *dest             = *destBuf;
    int32_t   capacity         = *destCapacity;
    int32_t   destIdx          =  0;
    int32_t   i;

    // If it wasn't supplied by the caller,  get the length of the replacement text.
    //   TODO:  slightly smarter logic in the copy loop could watch for the NUL on
    //          the fly and avoid this step.
    if (replacementLength == -1) {
        replacementLength = u_strlen(replacementText);
    }

    // Copy input string from the end of previous match to start of current match
    if (regexp->fText != NULL) {
        int32_t matchStart;
        int32_t lastMatchEnd;
        if (UTEXT_USES_U16(m->fInputText)) {
            lastMatchEnd = (int32_t)m->fLastMatchEnd;
            matchStart = (int32_t)m->fMatchStart;
        } else {
            // !!!: Would like a better way to do this!
            UErrorCode tempStatus = U_ZERO_ERROR;
            lastMatchEnd = utext_extract(m->fInputText, 0, m->fLastMatchEnd, NULL, 0, &tempStatus);
            tempStatus = U_ZERO_ERROR;
            matchStart = lastMatchEnd + utext_extract(m->fInputText, m->fLastMatchEnd, m->fMatchStart, NULL, 0, &tempStatus);
        }
        for (i=lastMatchEnd; i<matchStart; i++) {
            appendToBuf(regexp->fText[i], &destIdx, dest, capacity);
        }
    } else {
        UErrorCode possibleOverflowError = U_ZERO_ERROR; // ignore
        destIdx += utext_extract(m->fInputText, m->fLastMatchEnd, m->fMatchStart,
                                 dest==NULL?NULL:&dest[destIdx], REMAINING_CAPACITY(destIdx, capacity),
                                 &possibleOverflowError);
    }
    U_ASSERT(destIdx >= 0);

    // scan the replacement text, looking for substitutions ($n) and \escapes.
    int32_t  replIdx = 0;
    while (replIdx < replacementLength && U_SUCCESS(*status)) {
        UChar  c = replacementText[replIdx];
        replIdx++;
        if (c != DOLLARSIGN && c != BACKSLASH) {
            // Common case, no substitution, no escaping,
            //  just copy the char to the dest buf.
            appendToBuf(c, &destIdx, dest, capacity);
            continue;
        }

        if (c == BACKSLASH) {
            // Backslash Escape.  Copy the following char out without further checks.
            //                    Note:  Surrogate pairs don't need any special handling
            //                           The second half wont be a '$' or a '\', and
            //                           will move to the dest normally on the next
            //                           loop iteration.
            if (replIdx >= replacementLength) {
                break;
            }
            c = replacementText[replIdx];

            if (c==0x55/*U*/ || c==0x75/*u*/) {
                // We have a \udddd or \Udddddddd escape sequence.
                UChar32 escapedChar =
                    u_unescapeAt(uregex_ucstr_unescape_charAt,
                       &replIdx,                   // Index is updated by unescapeAt
                       replacementLength,          // Length of replacement text
                       (void *)replacementText);

                if (escapedChar != (UChar32)0xFFFFFFFF) {
                    if (escapedChar <= 0xffff) {
                        appendToBuf((UChar)escapedChar, &destIdx, dest, capacity);
                    } else {
                        appendToBuf(U16_LEAD(escapedChar), &destIdx, dest, capacity);
                        appendToBuf(U16_TRAIL(escapedChar), &destIdx, dest, capacity);
                    }
                    continue;
                }
                // Note:  if the \u escape was invalid, just fall through and
                //        treat it as a plain \<anything> escape.
            }

            // Plain backslash escape.  Just put out the escaped character.
            appendToBuf(c, &destIdx, dest, capacity);

            replIdx++;
            continue;
        }

        // We've got a $.  Pick up the following capture group name or number.
        // For numbers, consume only digits that produce a valid capture group for the pattern.

        int32_t groupNum  = 0;
        U_ASSERT(c == DOLLARSIGN);
        UChar32 c32 = -1;
        if (replIdx < replacementLength) {
            U16_GET(replacementText, 0, replIdx, replacementLength, c32);
        }
        if (u_isdigit(c32)) {
            int32_t numDigits = 0;
            int32_t numCaptureGroups = m->fPattern->fGroupMap->size();
            for (;;) {
                if (replIdx >= replacementLength) {
                    break;
                }
                U16_GET(replacementText, 0, replIdx, replacementLength, c32);
                if (u_isdigit(c32) == FALSE) {
                    break;
                }

                int32_t digitVal = u_charDigitValue(c32);
                if (groupNum * 10 + digitVal <= numCaptureGroups) {
                    groupNum = groupNum * 10 + digitVal;
                    U16_FWD_1(replacementText, replIdx, replacementLength);
                    numDigits++;
                } else {
                    if (numDigits == 0) {
                        *status = U_INDEX_OUTOFBOUNDS_ERROR;
                    }
                    break;
                }
            }
        } else if (c32 == LEFTBRACKET) {
            // Scan for Named Capture Group, ${name}.
            UnicodeString groupName;
            U16_FWD_1(replacementText, replIdx, replacementLength);
            while (U_SUCCESS(*status) && c32 != RIGHTBRACKET) { 
                if (replIdx >= replacementLength) {
                    *status = U_REGEX_INVALID_CAPTURE_GROUP_NAME;
                    break;
                }
                U16_NEXT(replacementText, replIdx, replacementLength, c32);
                if ((c32 >= 0x41 && c32 <= 0x5a) ||           // A..Z
                        (c32 >= 0x61 && c32 <= 0x7a) ||       // a..z
                        (c32 >= 0x31 && c32 <= 0x39)) {       // 0..9
                    groupName.append(c32);
                } else if (c32 == RIGHTBRACKET) {
                    groupNum = uhash_geti(regexp->fPat->fNamedCaptureMap, &groupName);
                    if (groupNum == 0) {
                        // Name not defined by pattern.
                        *status = U_REGEX_INVALID_CAPTURE_GROUP_NAME;
                    }
                } else {
                    // Character was something other than a name char or a closing '}'
                    *status = U_REGEX_INVALID_CAPTURE_GROUP_NAME;
                }
            }
        } else {
            // $ not followed by {name} or digits.
            *status = U_REGEX_INVALID_CAPTURE_GROUP_NAME;
        }


        // Finally, append the capture group data to the destination.
        if (U_SUCCESS(*status)) {
            destIdx += uregex_group((URegularExpression*)regexp, groupNum,
                                    dest==NULL?NULL:&dest[destIdx], REMAINING_CAPACITY(destIdx, capacity), status);
            if (*status == U_BUFFER_OVERFLOW_ERROR) {
                // Ignore buffer overflow when extracting the group.  We need to
                //   continue on to get full size of the untruncated result.  We will
                //   raise our own buffer overflow error at the end.
                *status = U_ZERO_ERROR;
            }
        }

        if (U_FAILURE(*status)) {
            // bad group number or name.
            break;
        }
    }

    //
    //  Nul Terminate the dest buffer if possible.
    //  Set the appropriate buffer overflow or not terminated error, if needed.
    //
    if (destIdx < capacity) {
        dest[destIdx] = 0;
    } else if (U_SUCCESS(*status)) {
        if (destIdx == *destCapacity) {
            *status = U_STRING_NOT_TERMINATED_WARNING;
        } else {
            *status = U_BUFFER_OVERFLOW_ERROR;
        }
    }

    //
    // Return an updated dest buffer and capacity to the caller.
    //
    if (destIdx > 0 &&  *destCapacity > 0) {
        if (destIdx < capacity) {
            *destBuf      += destIdx;
            *destCapacity -= destIdx;
        } else {
            *destBuf      += capacity;
            *destCapacity =  0;
        }
    }

    // If we came in with a buffer overflow, make sure we go out with one also.
    //   (A zero length match right at the end of the previous match could
    //    make this function succeed even though a previous call had overflowed the buf)
    if (pendingBufferOverflow && U_SUCCESS(*status)) {
        *status = U_BUFFER_OVERFLOW_ERROR;
    }

    return destIdx;
}